

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O1

bool __thiscall
cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaTargetGenerator *this,cmNinjaVars *vars)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar2;
  cmLocalNinjaGenerator *pcVar3;
  TargetType TVar4;
  char *pcVar5;
  string *psVar6;
  long *plVar7;
  cmGlobalNinjaGenerator *pcVar8;
  mapped_type *pmVar9;
  size_type *psVar10;
  bool bVar11;
  string pdbPath;
  string compilePdbPath;
  string local_f8;
  string local_d8;
  string local_b8;
  key_type local_98;
  cmNinjaVars *local_78;
  string local_70;
  string local_50;
  
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  paVar1 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar1;
  local_78 = vars;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"MSVC_C_ARCHITECTURE_ID","");
  pcVar5 = cmMakefile::GetDefinition(this_00,&local_d8);
  bVar11 = true;
  if (pcVar5 == (char *)0x0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_50,"MSVC_CXX_ARCHITECTURE_ID","");
    pcVar5 = cmMakefile::GetDefinition(this_00,&local_50);
    bVar11 = pcVar5 != (char *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if (bVar11 != false) {
    local_d8._M_string_length = 0;
    local_d8.field_2._M_local_buf[0] = '\0';
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    local_70._M_string_length = 0;
    local_70.field_2._M_local_buf[0] = '\0';
    local_d8._M_dataplus._M_p = (pointer)paVar1;
    TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((((TVar4 == EXECUTABLE) ||
         (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
         TVar4 == STATIC_LIBRARY)) ||
        (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
        TVar4 == SHARED_LIBRARY)) ||
       (TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget),
       TVar4 == MODULE_LIBRARY)) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBDirectory(&local_f8,pcVar2,psVar6);
      std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_d8);
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetPDBName(&local_f8,pcVar2,psVar6);
      std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_f8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
    }
    TVar4 = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
    if ((int)TVar4 < 5) {
      pcVar2 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      psVar6 = cmCommonTargetGenerator::GetConfigName_abi_cxx11_
                         (&this->super_cmCommonTargetGenerator);
      cmGeneratorTarget::GetCompilePDBPath(&local_f8,pcVar2,psVar6);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
      paVar1 = &local_f8.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f8._M_dataplus._M_p != paVar1) {
        operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
      }
      if (local_70._M_string_length == 0) {
        cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
                  (&local_b8,(this->super_cmCommonTargetGenerator).GeneratorTarget);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_b8);
        psVar10 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar10) {
          local_f8.field_2._M_allocated_capacity = *psVar10;
          local_f8.field_2._8_8_ = plVar7[3];
          local_f8._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_f8.field_2._M_allocated_capacity = *psVar10;
          local_f8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_f8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar10;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_f8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar1) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
    pcVar3 = this->LocalGenerator;
    pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(&local_b8,pcVar8,&local_d8);
    cmOutputConverter::ConvertToOutputFormat
              (&local_f8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_b8,SHELL);
    paVar1 = &local_98.field_2;
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"TARGET_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_78,&local_98);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    pcVar3 = this->LocalGenerator;
    pcVar8 = cmLocalNinjaGenerator::GetGlobalNinjaGenerator(pcVar3);
    cmGlobalNinjaGenerator::ConvertToNinjaPath(&local_b8,pcVar8,&local_70);
    cmOutputConverter::ConvertToOutputFormat
              (&local_f8,
               &(pcVar3->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                super_cmOutputConverter,&local_b8,SHELL);
    local_98._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"TARGET_COMPILE_PDB","");
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](local_78,&local_98);
    std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    EnsureParentDirectoryExists(this,&local_d8);
    EnsureParentDirectoryExists(this,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,
                      CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                               local_70.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
  }
  return bVar11;
}

Assistant:

bool cmNinjaTargetGenerator::SetMsvcTargetPdbVariable(cmNinjaVars& vars) const
{
  cmMakefile* mf = this->GetMakefile();
  if (mf->GetDefinition("MSVC_C_ARCHITECTURE_ID") ||
      mf->GetDefinition("MSVC_CXX_ARCHITECTURE_ID"))
    {
    std::string pdbPath;
    std::string compilePdbPath;
    if(this->GeneratorTarget->GetType() == cmState::EXECUTABLE ||
       this->GeneratorTarget->GetType() == cmState::STATIC_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::SHARED_LIBRARY ||
       this->GeneratorTarget->GetType() == cmState::MODULE_LIBRARY)
      {
      pdbPath = this->GeneratorTarget->GetPDBDirectory(this->GetConfigName());
      pdbPath += "/";
      pdbPath += this->GeneratorTarget->GetPDBName(this->GetConfigName());
      }
    if(this->GeneratorTarget->GetType() <= cmState::OBJECT_LIBRARY)
      {
      compilePdbPath =
              this->GeneratorTarget->GetCompilePDBPath(this->GetConfigName());
      if(compilePdbPath.empty())
        {
        compilePdbPath = this->GeneratorTarget->GetSupportDirectory() + "/";
        }
      }

    vars["TARGET_PDB"] = this->GetLocalGenerator()->ConvertToOutputFormat(
                          ConvertToNinjaPath(pdbPath),
                          cmLocalGenerator::SHELL);
    vars["TARGET_COMPILE_PDB"] =
      this->GetLocalGenerator()->ConvertToOutputFormat(
        ConvertToNinjaPath(compilePdbPath),
        cmLocalGenerator::SHELL);

    EnsureParentDirectoryExists(pdbPath);
    EnsureParentDirectoryExists(compilePdbPath);
    return true;
    }
  return false;
}